

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

OrphanBuilder *
capnp::_::OrphanBuilder::initStructList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,StructSize elementSize)

{
  int iVar1;
  undefined8 extraout_RAX;
  word *pwVar2;
  ulong uVar3;
  AllocateResult AVar4;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  CapTableBuilder *local_38;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  local_38 = capTable;
  if (0x1fffffff < elementCount) {
    ::anon_func::anon_class_1_0_00000001::operator()(&local_39);
  }
  uVar3 = (ulong)(((uint)elementSize & 0xffff) + ((uint)elementSize >> 0x10)) * (ulong)elementCount;
  if (0x1ffffffe < uVar3) {
    WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()(&local_3a);
  }
  if (arena != (BuilderArena *)0x0) {
    iVar1 = (int)uVar3;
    AVar4 = BuilderArena::allocate(arena,iVar1 + 1);
    pwVar2 = AVar4.words;
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = iVar1 * 8 + 7;
    *(ElementCount *)&pwVar2->content = elementCount << 2;
    *(StructDataWordCount *)((long)&pwVar2->content + 4) = elementSize.data;
    *(StructPointerCount *)((long)&pwVar2->content + 6) = elementSize.pointers;
    __return_storage_ptr__->segment = AVar4.segment;
    __return_storage_ptr__->capTable = local_38;
    __return_storage_ptr__->location = pwVar2;
    return __return_storage_ptr__;
  }
  WireHelpers::zeroObject((SegmentBuilder *)0x0,local_38,(WirePointer *)__return_storage_ptr__);
  if (__return_storage_ptr__->segment != (SegmentBuilder *)0x0) {
    euthanize(__return_storage_ptr__);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

OrphanBuilder OrphanBuilder::initStructList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, StructSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initStructListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}